

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonEachComputePath(JsonEachCursor *p,JsonString *pStr,u32 i)

{
  uint i_00;
  JsonNode *pJVar1;
  ulong uVar2;
  
  if (i == 0) {
    jsonAppendChar(pStr,'$');
    return;
  }
  i_00 = (p->sParse).aUp[i];
  jsonEachComputePath(p,pStr,i_00);
  pJVar1 = (p->sParse).aNode;
  if (pJVar1[i_00].eType == '\x06') {
    jsonPrintf(0x1e,pStr,"[%d]",(ulong)pJVar1[i_00].u.iAppend);
    return;
  }
  uVar2 = (ulong)((pJVar1[i].jnFlags & 0x40) >> 6);
  jsonPrintf(pJVar1[(ulong)i + (uVar2 - 1)].n + 1,pStr,".%.*s",
             (ulong)(pJVar1[(ulong)i + (uVar2 - 1)].n - 2),
             &(pJVar1[(ulong)i + (uVar2 - 1)].u.pPatch)->jnFlags);
  return;
}

Assistant:

static void jsonEachComputePath(
  JsonEachCursor *p,       /* The cursor */
  JsonString *pStr,        /* Write the path here */
  u32 i                    /* Path to this element */
){
  JsonNode *pNode, *pUp;
  u32 iUp;
  if( i==0 ){
    jsonAppendChar(pStr, '$');
    return;
  }
  iUp = p->sParse.aUp[i];
  jsonEachComputePath(p, pStr, iUp);
  pNode = &p->sParse.aNode[i];
  pUp = &p->sParse.aNode[iUp];
  if( pUp->eType==JSON_ARRAY ){
    jsonPrintf(30, pStr, "[%d]", pUp->u.iKey);
  }else{
    assert( pUp->eType==JSON_OBJECT );
    if( (pNode->jnFlags & JNODE_LABEL)==0 ) pNode--;
    assert( pNode->eType==JSON_STRING );
    assert( pNode->jnFlags & JNODE_LABEL );
    jsonPrintf(pNode->n+1, pStr, ".%.*s", pNode->n-2, pNode->u.zJContent+1);
  }
}